

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

ktx_error_code_e ktxHashList_FindEntry(ktxHashList *pHead,char *key,ktxHashListEntry **ppEntry)

{
  ktxHashList pkVar1;
  UT_hash_table *pUVar2;
  UT_hash_handle *pUVar3;
  size_t sVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  ktxHashListEntry *pkVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  if (key == (char *)0x0 || pHead == (ktxHashList *)0x0) {
    return KTX_INVALID_VALUE;
  }
  pkVar1 = *pHead;
  if (pkVar1 == (ktxHashList)0x0) {
    return KTX_NOT_FOUND;
  }
  sVar4 = strlen(key);
  pbVar5 = (byte *)(key + 0xb);
  uVar12 = 0x9e3779b9;
  uVar6 = 0xfeedbeef;
  uVar9 = 0x9e3779b9;
  uVar11 = sVar4 & 0xffffffff;
  while (uVar10 = (uint)uVar11, 0xb < uVar10) {
    iVar7 = uVar9 + (int)(char)pbVar5[-7] + (char)pbVar5[-6] * 0x100 +
            (uint)pbVar5[-4] * 0x1000000 + (char)pbVar5[-5] * 0x10000;
    uVar6 = uVar6 + (int)(char)pbVar5[-3] + (char)pbVar5[-2] * 0x100 +
            (uint)*pbVar5 * 0x1000000 + (char)pbVar5[-1] * 0x10000;
    uVar12 = uVar6 >> 0xd ^
             ((uVar12 + (int)(char)pbVar5[-0xb] + (char)pbVar5[-10] * 0x100 +
              (uint)pbVar5[-8] * 0x1000000 + (char)pbVar5[-9] * 0x10000) - iVar7) - uVar6;
    uVar9 = uVar12 << 8 ^ (iVar7 - uVar6) - uVar12;
    uVar6 = uVar9 >> 0xd ^ (uVar6 - uVar12) - uVar9;
    uVar12 = uVar6 >> 0xc ^ (uVar12 - uVar9) - uVar6;
    uVar9 = uVar12 << 0x10 ^ (uVar9 - uVar6) - uVar12;
    uVar6 = uVar9 >> 5 ^ (uVar6 - uVar12) - uVar9;
    uVar12 = uVar6 >> 3 ^ (uVar12 - uVar9) - uVar6;
    uVar9 = uVar12 << 10 ^ (uVar9 - uVar6) - uVar12;
    uVar6 = uVar9 >> 0xf ^ (uVar6 - uVar12) - uVar9;
    pbVar5 = pbVar5 + 0xc;
    uVar11 = (ulong)(uVar10 - 0xc);
  }
  uVar6 = uVar6 + (uint)sVar4;
  switch(uVar10) {
  case 1:
    goto LAB_001ec0d2;
  case 2:
    goto LAB_001ec0c7;
  case 3:
    goto LAB_001ec0bc;
  case 4:
    goto LAB_001ec0b1;
  case 5:
    goto LAB_001ec0a9;
  case 6:
    goto LAB_001ec09e;
  case 7:
    goto LAB_001ec093;
  case 8:
    break;
  case 0xb:
    uVar6 = (uint)pbVar5[-1] * 0x1000000 + uVar6;
  case 10:
    uVar6 = (char)pbVar5[-2] * 0x10000 + uVar6;
  case 9:
    uVar6 = (char)pbVar5[-3] * 0x100 + uVar6;
    break;
  default:
    goto switchD_001ec025_default;
  }
  uVar9 = (uint)pbVar5[-4] * 0x1000000 + uVar9;
LAB_001ec093:
  uVar9 = (char)pbVar5[-5] * 0x10000 + uVar9;
LAB_001ec09e:
  uVar9 = (char)pbVar5[-6] * 0x100 + uVar9;
LAB_001ec0a9:
  uVar9 = (int)(char)pbVar5[-7] + uVar9;
LAB_001ec0b1:
  uVar12 = (uint)pbVar5[-8] * 0x1000000 + uVar12;
LAB_001ec0bc:
  uVar12 = (char)pbVar5[-9] * 0x10000 + uVar12;
LAB_001ec0c7:
  uVar12 = (char)pbVar5[-10] * 0x100 + uVar12;
LAB_001ec0d2:
  uVar12 = (int)(char)pbVar5[-0xb] + uVar12;
switchD_001ec025_default:
  uVar12 = uVar6 >> 0xd ^ (uVar12 - uVar6) - uVar9;
  uVar10 = uVar12 << 8 ^ (uVar9 - uVar6) - uVar12;
  uVar9 = uVar10 >> 0xd ^ (uVar6 - uVar12) - uVar10;
  uVar6 = uVar9 >> 0xc ^ (uVar12 - uVar10) - uVar9;
  uVar12 = uVar6 << 0x10 ^ (uVar10 - uVar9) - uVar6;
  uVar9 = uVar12 >> 5 ^ (uVar9 - uVar6) - uVar12;
  uVar6 = uVar9 >> 3 ^ (uVar6 - uVar12) - uVar9;
  uVar12 = uVar6 << 10 ^ (uVar12 - uVar9) - uVar6;
  pUVar2 = (pkVar1->hh).tbl;
  pUVar3 = pUVar2->buckets[pUVar2->num_buckets - 1 & (uVar12 >> 0xf ^ uVar9 - (uVar6 + uVar12))].
           hh_head;
  if (pUVar3 == (UT_hash_handle *)0x0) {
    pkVar8 = (ktxHashListEntry *)0x0;
  }
  else {
    pkVar8 = (ktxHashListEntry *)((long)pUVar3 - pUVar2->hho);
  }
  while( true ) {
    if (pkVar8 == (ktxHashListEntry *)0x0) {
      return KTX_NOT_FOUND;
    }
    if (((pkVar8->hh).keylen == (uint)sVar4) &&
       (iVar7 = bcmp((pkVar8->hh).key,key,sVar4 & 0xffffffff), iVar7 == 0)) break;
    pUVar3 = (pkVar8->hh).hh_next;
    pkVar8 = (ktxHashListEntry *)0x0;
    if (pUVar3 != (UT_hash_handle *)0x0) {
      pkVar8 = (ktxHashListEntry *)((long)pUVar3 - pUVar2->hho);
    }
  }
  *ppEntry = pkVar8;
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
ktxHashList_FindEntry(ktxHashList* pHead, const char* key,
                      ktxHashListEntry** ppEntry)
{
    if (pHead && key) {
        ktxKVListEntry* kv;

        HASH_FIND_STR( *pHead, key, kv );  /* kv: output pointer */

        if (kv) {
            *ppEntry = kv;
            return KTX_SUCCESS;
        } else
            return KTX_NOT_FOUND;
    } else
        return KTX_INVALID_VALUE;
}